

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall
fasttext::Model::dfs
          (Model *this,int32_t k,real threshold,int32_t node,real score,
          vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *heap,
          Vector *hidden)

{
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  __last;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  __last_00;
  size_type sVar1;
  reference pvVar2;
  const_reference pvVar3;
  element_type *peVar4;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  in_RCX;
  int in_EDX;
  int in_ESI;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  in_RDI;
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *in_R8;
  undefined4 in_XMM0_Da;
  real rVar5;
  float in_XMM1_Da;
  real f;
  undefined4 in_stack_ffffffffffffff68;
  real in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  float fVar6;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int64_t in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  float in_stack_ffffffffffffff9c;
  float fVar7;
  undefined4 in_stack_ffffffffffffffac;
  Matrix *in_stack_ffffffffffffffb0;
  Vector *in_stack_ffffffffffffffd0;
  pair<float,_int> *this_00;
  int iVar8;
  
  fVar7 = in_XMM1_Da;
  rVar5 = std_log((Model *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                  in_stack_ffffffffffffff6c);
  if ((rVar5 <= in_XMM1_Da) &&
     ((sVar1 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::size
                         ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                          in_RCX._M_current), fVar6 = fVar7, sVar1 != (long)in_ESI ||
      (pvVar2 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::front
                          ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *
                           )CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)),
      in_stack_ffffffffffffff9c = fVar7, pvVar2->first <= fVar7)))) {
    pvVar3 = std::vector<fasttext::Node,_std::allocator<fasttext::Node>_>::operator[]
                       ((vector<fasttext::Node,_std::allocator<fasttext::Node>_> *)
                        &(((QMatrix *)((long)in_RDI._M_current + 0x120))->codes_).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)in_EDX);
    if ((pvVar3->left == -1) &&
       (pvVar3 = std::vector<fasttext::Node,_std::allocator<fasttext::Node>_>::operator[]
                           ((vector<fasttext::Node,_std::allocator<fasttext::Node>_> *)
                            &(((QMatrix *)((long)in_RDI._M_current + 0x120))->codes_).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,(long)in_EDX),
       pvVar3->right == -1)) {
      this_00 = in_RCX._M_current;
      std::make_pair<float&,int&>
                ((float *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                 (int *)0x17aa9e);
      std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::push_back
                ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 (value_type *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::begin
                ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                 CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::end
                ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                 CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      __last_00._M_current._4_4_ = in_stack_ffffffffffffff9c;
      __last_00._M_current._0_4_ = in_stack_ffffffffffffff98;
      std::
      push_heap<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,bool(*)(std::pair<float,int>const&,std::pair<float,int>const&)>
                (in_RDI,__last_00,
                 (_func_bool_pair<float,_int>_ptr_pair<float,_int>_ptr *)in_RCX._M_current);
      sVar1 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::size
                        ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                         this_00);
      if ((ulong)(long)in_ESI < sVar1) {
        std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::begin
                  ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                   CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::end
                  ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                   CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        __last._M_current._4_4_ = in_stack_ffffffffffffff8c;
        __last._M_current._0_4_ = in_stack_ffffffffffffff88;
        std::
        pop_heap<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,bool(*)(std::pair<float,int>const&,std::pair<float,int>const&)>
                  (in_RCX,__last,
                   (_func_bool_pair<float,_int>_ptr_pair<float,_int>_ptr *)
                   CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
        std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::pop_back
                  ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                   0x17ab3b);
      }
    }
    else {
      if (((((QMatrix *)((long)in_RDI._M_current + 0x120))->qnorm_ & 1U) == 0) ||
         (peVar4 = std::
                   __shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x17ab5c), (peVar4->qout & 1U) == 0)) {
        std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x17abab);
        rVar5 = Matrix::dotRow(in_stack_ffffffffffffffb0,
                               (Vector *)CONCAT44(in_stack_ffffffffffffffac,in_XMM1_Da),
                               (int64_t)in_RDI._M_current);
      }
      else {
        std::__shared_ptr_access<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x17ab73);
        rVar5 = QMatrix::dotRow((QMatrix *)in_RDI._M_current,
                                (Vector *)
                                CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                                in_stack_ffffffffffffff90);
      }
      std::exp((double)(ulong)(uint)-rVar5);
      iVar8 = in_ESI;
      std::vector<fasttext::Node,_std::allocator<fasttext::Node>_>::operator[]
                ((vector<fasttext::Node,_std::allocator<fasttext::Node>_> *)
                 &(((QMatrix *)((long)in_RDI._M_current + 0x120))->codes_).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(long)in_EDX);
      fVar7 = fVar6;
      std_log((Model *)CONCAT44(in_ESI,fVar6),in_stack_ffffffffffffff6c);
      dfs((Model *)CONCAT44(iVar8,in_XMM0_Da),in_EDX,fVar7,
          (int32_t)((ulong)in_RCX._M_current >> 0x20),SUB84(in_RCX._M_current,0),in_R8,
          in_stack_ffffffffffffffd0);
      std::vector<fasttext::Node,_std::allocator<fasttext::Node>_>::operator[]
                ((vector<fasttext::Node,_std::allocator<fasttext::Node>_> *)
                 &(((QMatrix *)((long)in_RDI._M_current + 0x120))->codes_).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(long)in_EDX);
      std_log((Model *)CONCAT44(in_ESI,fVar6),in_stack_ffffffffffffff6c);
      dfs((Model *)CONCAT44(iVar8,in_XMM0_Da),in_EDX,fVar7,
          (int32_t)((ulong)in_RCX._M_current >> 0x20),SUB84(in_RCX._M_current,0),in_R8,
          in_stack_ffffffffffffffd0);
    }
  }
  return;
}

Assistant:

void Model::dfs(
		int32_t k,
		real threshold,
		int32_t node,
		real score,
		std::vector<std::pair<real, int32_t>>& heap,
		Vector& hidden) const {
	if (score < std_log(threshold)) {
		return;
	}
	if (heap.size() == k && score < heap.front().first) {
		return;
	}

	if (tree[node].left == -1 && tree[node].right == -1) {
		heap.push_back(std::make_pair(score, node));
		std::push_heap(heap.begin(), heap.end(), comparePairs);
		if (heap.size() > k) {
			std::pop_heap(heap.begin(), heap.end(), comparePairs);
			heap.pop_back();
		}
		return;
	}

	real f;
	if (quant_ && args_->qout) {
		f = qwo_->dotRow(hidden, node - osz_);
	} else {
		f = wo_->dotRow(hidden, node - osz_);
	}
	f = 1. / (1 + std::exp(-f));

	dfs(k, threshold, tree[node].left, score + std_log(1.0 - f), heap, hidden);
	dfs(k, threshold, tree[node].right, score + std_log(f), heap, hidden);
}